

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v10::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  uint uVar2;
  type tVar3;
  char *pcVar4;
  char *pcVar5;
  type in_register_00000014;
  type atVar6 [2];
  ulong uVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  atVar6[1] = in_register_00000014;
  atVar6[0] = error_code;
  buffer<char>::try_resize((buffer<char> *)this,0);
  uVar7 = (ulong)(uint)-(int)out;
  if (0 < (int)out) {
    uVar7 = (ulong)out & 0xffffffff;
  }
  uVar2 = (uint)uVar7 | 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  tVar3 = to_unsigned<int>((int)(uVar7 + *(long *)(do_count_digits(unsigned_int)::table +
                                                  (ulong)uVar1 * 8) >> 0x20));
  if (message.data_ <= (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) + (ulong)tVar3))) {
    local_68.types_[0] = string_type;
    local_68.types_[1] = cstring_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "{}{}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 4;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         parse_format_specs<fmt::v10::basic_string_view<char>,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_68.parse_funcs_[1] =
         parse_format_specs<char[3],fmt::v10::detail::compile_parse_context<char>>;
    pcVar4 = "{}{}";
    local_68.context_.types_ = local_68.types_;
    while (pcVar5 = pcVar4, pcVar5 != "") {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) goto LAB_0023043a;
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,fmt::v10::basic_string_view<char>,char[3]>&>
                           (pcVar5,"",&local_68);
      }
    }
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x294c33;
    fmt.size_ = 4;
    fmt.data_ = "{}{}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
    args.desc_ = 0xcd;
    local_68.types_ = atVar6;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = message.data_;
    vformat_to<fmt::v10::appender,_0>((appender)this,fmt,args);
  }
  local_68.types_[0] = cstring_type;
  local_68.types_[1] = int_type;
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "{}{}";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 4;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
  local_68.parse_funcs_[0] =
       parse_format_specs<char[7],fmt::v10::detail::compile_parse_context<char>>;
  local_68.parse_funcs_[1] = parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
  pcVar4 = "{}{}";
  local_68.context_.types_ = local_68.types_;
  while( true ) {
    while( true ) {
      pcVar5 = pcVar4;
      if (pcVar5 == "") {
        local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
             (ulong)out & 0xffffffff;
        local_68.types_ = (type  [2])0x2946b0;
        fmt_00.size_ = 4;
        fmt_00.data_ = "{}{}";
        args_00.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
        args_00.desc_ = 0x1c;
        vformat_to<fmt::v10::appender,_0>((appender)this,fmt_00,args_00);
        if (*(ulong *)(this + 0x10) < 0x1f5) {
          return;
        }
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                    ,0x3f,"");
      }
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') break;
      if (*pcVar5 == '{') {
        pcVar4 = parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[7],int>&>
                           (pcVar5,"",&local_68);
      }
    }
    if ((pcVar4 == "") || (*pcVar4 != '}')) break;
    pcVar4 = pcVar5 + 2;
  }
LAB_0023043a:
  throw_format_error("unmatched \'}\' in format string");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}